

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_class_effect_yx(parser *p)

{
  long lVar1;
  long *plVar2;
  wchar_t wVar3;
  void *pvVar4;
  long *plVar5;
  long lVar6;
  parser_error pVar7;
  
  pvVar4 = parser_priv(p);
  pVar7 = PARSE_ERROR_MISSING_RECORD_HEADER;
  if (pvVar4 != (void *)0x0) {
    wVar3 = *(wchar_t *)((long)pvVar4 + 0x108);
    if (0 < (long)wVar3) {
      lVar1 = *(long *)((long)pvVar4 + 0x110);
      if ((lVar1 == 0) || (class_max_books < wVar3)) {
        __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                      ,0xfea,"enum parser_error parse_class_effect_yx(struct parser *)");
      }
      lVar6 = (long)wVar3 * 0x20;
      wVar3 = *(wchar_t *)(lVar1 + -0x14 + lVar6);
      if (0 < (long)wVar3) {
        lVar1 = *(long *)(lVar1 + lVar6 + -8);
        if ((lVar1 == 0) || (book_max_spells < wVar3)) {
          __assert_fail("book->spells && book->num_spells <= book_max_spells",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                        ,0xff0,"enum parser_error parse_class_effect_yx(struct parser *)");
        }
        plVar2 = *(long **)(lVar1 + -0x28 + (long)wVar3 * 0x38);
        pVar7 = PARSE_ERROR_NONE;
        if (plVar2 != (long *)0x0) {
          do {
            plVar5 = plVar2;
            plVar2 = (long *)*plVar5;
          } while ((long *)*plVar5 != (long *)0x0);
          wVar3 = parser_getint(p,"y");
          *(wchar_t *)(plVar5 + 3) = wVar3;
          wVar3 = parser_getint(p,"x");
          *(wchar_t *)((long)plVar5 + 0x1c) = wVar3;
          pVar7 = PARSE_ERROR_NONE;
        }
      }
    }
  }
  return pVar7;
}

Assistant:

static enum parser_error parse_class_effect_yx(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;
	struct effect *effect;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	/* If there is no effect, assume that this is human and not parser error. */
	effect = spell->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;
	effect->y = parser_getint(p, "y");
	effect->x = parser_getint(p, "x");

	return PARSE_ERROR_NONE;
}